

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::MapToNeighSide<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,int side,int SideDim,
          TPZVec<Fad<double>_> *InternalPar,TPZVec<Fad<double>_> *NeighPar,
          TPZFMatrix<Fad<double>_> *JacNeighSide)

{
  bool bVar1;
  TPZManVector<Fad<double>,_3> SidePar;
  TPZFNMatrix<9,_Fad<double>_> JacSide;
  TPZTransform<Fad<double>_> tr;
  int local_574;
  TPZManVector<Fad<double>,_3> local_570;
  TPZFNMatrix<9,_Fad<double>_> local_4f0;
  TPZTransform<Fad<double>_> local_320;
  
  local_574 = side;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&local_4f0);
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_570,(long)SideDim);
  bVar1 = pztopology::TPZQuadrilateral::CheckProjectionForSingularity<Fad<double>>
                    (&local_574,InternalPar);
  pztopology::TPZQuadrilateral::MapToSide<Fad<double>>
            (local_574,InternalPar,&local_570.super_TPZVec<Fad<double>_>,
             &local_4f0.super_TPZFMatrix<Fad<double>_>);
  if (bVar1) {
    (*NeighPar->_vptr_TPZVec[3])(NeighPar,(long)SideDim);
    TPZTransform<Fad<double>_>::TPZTransform(&local_320);
    TransfBetweenNeigh<Fad<double>>(this,local_574,&local_320);
    TPZTransform<Fad<double>_>::Apply(&local_320,&local_570.super_TPZVec<Fad<double>_>,NeighPar);
    (*(JacNeighSide->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xd])(JacNeighSide,0,0);
    TransfBetweenNeigh<Fad<double>>(this,local_574,&local_320);
    (*(JacNeighSide->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xd])
              (JacNeighSide,
               local_320.fMult.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
               super_TPZBaseMatrix.fRow,
               local_4f0.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
               super_TPZBaseMatrix.fCol);
    (*local_320.fMult.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (&local_320.fMult,&local_4f0,JacNeighSide,0);
    TPZTransform<Fad<double>_>::~TPZTransform(&local_320);
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_570);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&local_4f0);
  return bVar1;
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }